

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_hmac_sha256_finalize(secp256k1_hmac_sha256 *hash,uchar *out32)

{
  unsigned_long _zzq_result;
  uchar temp [32];
  unsigned_long _zzq_args [6];
  uchar local_68 [40];
  uchar *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  secp256k1_sha256_finalize(&hash->inner,local_68);
  secp256k1_sha256_write(&hash->outer,local_68,0x20);
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  local_68[0x20] = '\x01';
  local_68[0x21] = '\0';
  local_68[0x22] = 'C';
  local_68[0x23] = 'M';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_38 = 0x20;
  local_30 = 0;
  local_28 = 0;
  local_20 = 0;
  local_40 = local_68;
  secp256k1_sha256_finalize(&hash->outer,out32);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_finalize(secp256k1_hmac_sha256 *hash, unsigned char *out32) {
    unsigned char temp[32];
    secp256k1_sha256_finalize(&hash->inner, temp);
    secp256k1_sha256_write(&hash->outer, temp, 32);
    secp256k1_memclear(temp, sizeof(temp));
    secp256k1_sha256_finalize(&hash->outer, out32);
}